

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void __thiscall
duckdb::ModeState<float,_duckdb::ModeStandard<float>_>::ModeRm
          (ModeState<float,_duckdb::ModeStandard<float>_> *this,idx_t frame)

{
  DataChunk *result;
  float fVar1;
  ColumnDataScanState *state;
  float *pfVar2;
  size_t sVar3;
  idx_t iVar4;
  reference pvVar5;
  mapped_type *pmVar6;
  
  state = this->scan;
  if ((state->next_row_index <= frame) || (frame < state->current_row_index)) {
    result = &this->page;
    ColumnDataCollection::Seek(this->inputs,frame,state,result);
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    this->data = (float *)pvVar5->data;
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    FlatVector::VerifyFlatVector(pvVar5);
    this->validity = &pvVar5->validity;
  }
  iVar4 = this->scan->current_row_index;
  pfVar2 = this->data;
  pmVar6 = ::std::__detail::
           _Map_base<float,_std::pair<const_float,_duckdb::ModeAttr>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<float,_std::pair<const_float,_duckdb::ModeAttr>,_std::allocator<std::pair<const_float,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<float>,_std::hash<float>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->frequency_map,pfVar2 + (uint)((int)frame - (int)iVar4));
  sVar3 = pmVar6->count;
  this->nonzero = this->nonzero - (ulong)(sVar3 == 1);
  pmVar6->count = sVar3 - 1;
  if (((this->count == sVar3) &&
      (fVar1 = pfVar2[(uint)((int)frame - (int)iVar4)], fVar1 == *this->mode)) &&
     (!NAN(fVar1) && !NAN(*this->mode))) {
    this->valid = false;
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}